

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkOptNodeAnalyze
               (Acb_Mfs_t *p,int PivotVar,int nDivs,int nValues,int *pValues,Vec_Int_t *vSupp)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined8 uVar4;
  uint local_698;
  int local_694;
  int local_684;
  int local_678;
  int local_674;
  int *pOffSet;
  int *pOnSet;
  int *pStart;
  int stop;
  int start;
  int nFrames;
  int f;
  int i;
  int d;
  int nScope;
  int s;
  word Diffs [64];
  word OffSet [64];
  word OnSet [64];
  Vec_Int_t *vSupp_local;
  int *pValues_local;
  int nValues_local;
  int nDivs_local;
  int PivotVar_local;
  Acb_Mfs_t *p_local;
  
  memset(OffSet + 0x3f,0,0x200);
  memset(Diffs + 0x3f,0,0x200);
  memset(&nScope,0,0x200);
  iVar1 = nDivs * 2 + 1;
  uVar2 = nValues / iVar1;
  if (nDivs < 0x40) {
    local_674 = 0;
    local_678 = nDivs;
  }
  else {
    local_674 = nDivs + -0x40;
    local_678 = 0x40;
  }
  if (nValues % iVar1 == 0) {
    if ((int)uVar2 < 0x11) {
      for (start = 0; start < (int)uVar2; start = start + 1) {
        piVar3 = pValues + start * iVar1;
        local_684 = nDivs;
        if (*piVar3 != 0) {
          local_684 = 0;
        }
        local_694 = nDivs;
        if (*piVar3 == 0) {
          local_694 = 0;
        }
        printf("%2d:",(ulong)(uint)start);
        for (d = local_674; d < local_678; d = d + 1) {
          printf("%d",(ulong)(uint)piVar3[(long)local_684 + (long)d + 1]);
        }
        printf("\n");
        printf("%2d:",(ulong)(uint)start);
        for (d = local_674; d < local_678; d = d + 1) {
          printf("%d",(ulong)(uint)piVar3[(long)local_694 + (long)d + 1]);
        }
        printf("\n");
        for (d = local_674; d < local_678; d = d + 1) {
          if (piVar3[(long)local_684 + (long)d + 1] != 0) {
            OffSet[(long)start + 0x3f] =
                 1L << ((char)d - (char)local_674 & 0x3fU) | OffSet[(long)start + 0x3f];
          }
          if (piVar3[(long)local_694 + (long)d + 1] != 0) {
            Diffs[(long)start + 0x3f] =
                 1L << ((char)d - (char)local_674 & 0x3fU) | Diffs[(long)start + 0x3f];
          }
        }
      }
      f = 0;
      for (start = 0; start < (int)uVar2; start = start + 1) {
        for (d = 0; d < (int)uVar2; d = d + 1) {
          nFrames = 0;
          while ((nFrames < f &&
                 (*(ulong *)(&nScope + (long)nFrames * 2) !=
                  (OffSet[(long)start + 0x3f] ^ Diffs[(long)d + 0x3f])))) {
            nFrames = nFrames + 1;
          }
          if ((f <= nFrames) && (f < 0x40)) {
            *(word *)(&nScope + (long)f * 2) = OffSet[(long)start + 0x3f] ^ Diffs[(long)d + 0x3f];
            f = f + 1;
          }
        }
      }
      printf("Divisors = %d.  Frames = %d.  Patterns = %d.\n",(ulong)(uint)nDivs,(ulong)uVar2,
             (ulong)(uint)f);
      printf("   ");
      for (d = local_674; d < local_678; d = d + 1) {
        printf("%d",(long)d / 10 & 0xffffffff,(long)d % 10 & 0xffffffff);
      }
      printf("\n");
      printf("   ");
      for (d = local_674; d < local_678; d = d + 1) {
        printf("%d",(long)d % 10 & 0xffffffff);
      }
      printf("\n");
      printf("   ");
      for (d = local_674; d < local_678; d = d + 1) {
        iVar1 = Vec_IntFind(vSupp,d);
        if (iVar1 < 0) {
          local_698 = 0x20;
        }
        else {
          iVar1 = Vec_IntFind(vSupp,d);
          local_698 = iVar1 + 0x61;
        }
        printf("%c",(ulong)local_698);
      }
      printf("\n");
      for (d = 0; d < f; d = d + 1) {
        printf("%2d:",(ulong)(uint)d);
        for (start = 0; start < local_678; start = start + 1) {
          uVar4 = 0x20;
          if ((*(ulong *)(&nScope + (long)d * 2) >> ((byte)start & 0x3f) & 1) != 0) {
            uVar4 = 0x2a;
          }
          printf("%c",uVar4);
        }
        printf("\n");
      }
      return;
    }
    __assert_fail("nFrames <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x4d5,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  __assert_fail("nValues % nScope == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x4d4,"void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)")
  ;
}

Assistant:

void Acb_NtkOptNodeAnalyze( Acb_Mfs_t * p, int PivotVar, int nDivs, int nValues, int * pValues, Vec_Int_t * vSupp )
{
    word OnSet[64] = {0};
    word OffSet[64] = {0};
    word Diffs[64] = {0};
    int s, nScope = 1 + 2*nDivs, d, i;
    int f, nFrames = nValues / nScope;
    int start = nDivs < 64 ? 0 : nDivs - 64;
    int stop  = nDivs < 64 ? nDivs : 64;
    assert( nValues % nScope == 0 );
    assert( nFrames <= 16 );
    for ( f = 0; f < nFrames; f++ )
    {
        int * pStart  = pValues + f * nScope;
        int * pOnSet  = pStart + 1 + (pStart[0] ? 0 : nDivs);
        int * pOffSet = pStart + 1 + (pStart[0] ? nDivs : 0);

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOnSet[s] );
        printf( "\n" );

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOffSet[s] );
        printf( "\n" );

        for ( s = start; s < stop; s++ )
        {
            if ( pOnSet[s] )   OnSet[f]  |= (((word)1) << (s-start));
            if ( pOffSet[s] )  OffSet[f] |= (((word)1) << (s-start));
        }
    }
    d = 0;
    for ( f = 0; f < nFrames; f++ )
    for ( s = 0; s < nFrames; s++ )
    {
        for ( i = 0; i < d; i++ )
            if ( Diffs[i] == (OnSet[f] ^ OffSet[s]) )
                break;
        if ( i < d )
            continue;
        if ( d < 64 )
            Diffs[d++] = OnSet[f] ^ OffSet[s];
    }

    printf( "Divisors = %d.  Frames = %d.  Patterns = %d.\n", nDivs, nFrames, d );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s / 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s % 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%c", Vec_IntFind(vSupp, s) >= 0 ? 'a' + Vec_IntFind(vSupp, s) : ' ' );
    printf( "\n" );
    for ( s = 0; s < d; s++ )
    {
        printf( "%2d:", s );
        for ( f = 0; f < stop; f++ )
            printf( "%c", ((Diffs[s] >> f) & 1) ? '*' : ' ' );
        printf( "\n" );
    }
}